

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionTaperedTimoshenko.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric::ComputeInertiaMatrix
          (ChBeamSectionTaperedTimoshenkoAdvancedGeneric *this,ChMatrixDynamic<> *M)

{
  ChMatrixNM<double,_12,_12> Mtmp;
  Matrix<double,_12,_12,_1,_12,_12> MStack_500;
  
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&M->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,0xc,0xc);
  (*this->_vptr_ChBeamSectionTaperedTimoshenkoAdvancedGeneric[6])(this);
  (**(code **)((long)this->_vptr_ChBeamSectionTaperedTimoshenkoAdvancedGeneric +
              (ulong)((this->use_lumped_mass_matrix ^ 1) << 4) + 0x40))(this,&MStack_500);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,12,12,1,12,12>>
            (M,&MStack_500);
  return;
}

Assistant:

void ChBeamSectionTaperedTimoshenkoAdvancedGeneric::ComputeInertiaMatrix(ChMatrixDynamic<>& M) {
    M.setZero(12, 12);

    ComputeAverageSectionParameters();

    ChMatrixNM<double, 12, 12> Mtmp;

    if (use_lumped_mass_matrix) {
        ComputeLumpedInertiaMatrix(Mtmp);
    } else {
        // The most generic function for consistent mass matrix
        ComputeConsistentInertiaMatrix(Mtmp);

        // A simple function for consistent mass matrix, do quick transformation by matrix manipulation
        // Has been validated to be wrong! NEVER use it again
        // ComputeSimpleConsistentInertiaMatrix(Mtmp);
    }
    M = Mtmp;  // transform from ChMatrixNM<double, 12, 12> to ChMatrixDynamic<>
}